

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

void voronoiAccess3D(uint64_t sha,int x,int y,int z,int *x4,int *y4,int *z4)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int a;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  uint64_t d;
  int rz;
  int ry;
  int rx;
  int cz;
  int cy;
  int cx;
  int bz;
  int by;
  int bx;
  int i;
  uint64_t dmin;
  int az;
  int ay;
  int ax;
  int dz;
  int dy;
  int dx;
  int pZ;
  int pY;
  int pX;
  int *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  undefined4 local_80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  uint uVar6;
  undefined8 local_58;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_58 = (int *)0xffffffffffffffff;
  for (uVar6 = 0; (int)uVar6 < 8; uVar6 = uVar6 + 1) {
    uVar1 = (uint)((uVar6 & 4) != 0);
    uVar2 = (uint)((uVar6 & 2) != 0);
    uVar3 = (uint)((uVar6 & 1) != 0);
    iVar4 = ((int)(in_ESI - 2U) >> 2) + uVar1;
    iVar5 = ((int)(in_EDX - 2U) >> 2) + uVar2;
    a = ((int)(in_ECX - 2U) >> 2) + uVar3;
    getVoronoiCell(CONCAT44(iVar4,iVar5),a,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                   in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(int *)CONCAT44(uVar6,uVar1))
    ;
    in_stack_ffffffffffffff88 =
         (in_ESI - 2U & 3) * 0x2800 + uVar1 * -0xa000 + in_stack_ffffffffffffff88;
    in_stack_ffffffffffffff84 =
         (in_EDX - 2U & 3) * 0x2800 + uVar2 * -0xa000 + in_stack_ffffffffffffff84;
    local_80 = (in_ECX - 2U & 3) * 0x2800 + uVar3 * -0xa000 + local_80;
    in_stack_ffffffffffffff78 =
         (int *)((long)in_stack_ffffffffffffff88 * (long)in_stack_ffffffffffffff88 +
                 (long)in_stack_ffffffffffffff84 * (long)in_stack_ffffffffffffff84 +
                (long)local_80 * (long)local_80);
    if (in_stack_ffffffffffffff78 < local_58) {
      local_58 = in_stack_ffffffffffffff78;
      local_4c = a;
      local_48 = iVar5;
      local_44 = iVar4;
    }
  }
  if (in_R8 != (int *)0x0) {
    *in_R8 = local_44;
  }
  if (in_R9 != (int *)0x0) {
    *in_R9 = local_48;
  }
  if (in_stack_00000008 != (int *)0x0) {
    *in_stack_00000008 = local_4c;
  }
  return;
}

Assistant:

void voronoiAccess3D(uint64_t sha, int x, int y, int z, int *x4, int *y4, int *z4)
{
    x -= 2;
    y -= 2;
    z -= 2;
    int pX = x >> 2;
    int pY = y >> 2;
    int pZ = z >> 2;
    int dx = (x & 3) * 10240;
    int dy = (y & 3) * 10240;
    int dz = (z & 3) * 10240;
    int ax = 0, ay = 0, az = 0;
    uint64_t dmin = (uint64_t)-1;
    int i;

    for (i = 0; i < 8; i++)
    {
        int bx = (i & 4) != 0;
        int by = (i & 2) != 0;
        int bz = (i & 1) != 0;
        int cx = pX + bx;
        int cy = pY + by;
        int cz = pZ + bz;
        int rx, ry, rz;

        getVoronoiCell(sha, cx, cy, cz, &rx, &ry, &rz);

        rx += dx - 40*1024*bx;
        ry += dy - 40*1024*by;
        rz += dz - 40*1024*bz;

        uint64_t d = rx*(uint64_t)rx + ry*(uint64_t)ry + rz*(uint64_t)rz;
        if (d < dmin)
        {
            dmin = d;
            ax = cx;
            ay = cy;
            az = cz;
        }
    }

    if (x4) *x4 = ax;
    if (y4) *y4 = ay;
    if (z4) *z4 = az;
}